

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O1

void __thiscall MallocBlock::Initialize(MallocBlock *this,size_t size,int type)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  SpinLock SVar4;
  ThreadCache *pTVar5;
  FreeList *pFVar6;
  AllocMap *pAVar7;
  Object *__s;
  uint uVar8;
  undefined8 uVar9;
  char *pcVar10;
  MallocBlock *cthis;
  uint uVar11;
  long *in_FS_OFFSET;
  bool bVar12;
  ThreadCachePtr TVar13;
  
  if ((this->magic1_ != 0xabcdefab) && (this->magic1_ != 0xdeadbeef)) {
    pcVar10 = "Check failed: IsValidMagicValue(magic1_): \n";
    uVar9 = 0x2b;
    goto LAB_00118d12;
  }
  LOCK();
  bVar12 = (__atomic_base<int>)alloc_map_lock_.lockword_.super___atomic_base<int>._M_i ==
           (__atomic_base<int>)0x0;
  if (bVar12) {
    alloc_map_lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x1;
  }
  UNLOCK();
  if (!bVar12) {
    SpinLock::SlowLock(&alloc_map_lock_);
  }
  if (alloc_map_ == (AllocMap *)0x0) {
    pTVar5 = (ThreadCache *)*in_FS_OFFSET;
    if (pTVar5 == (ThreadCache *)0x0) {
      TVar13 = tcmalloc::ThreadCachePtr::GetSlow();
      pTVar5 = TVar13.ptr_;
    }
    uVar11 = (uint)DAT_0013d20d;
    uVar3 = (ulong)DAT_0013d20d;
    iVar1 = pTVar5->list_[uVar3].size_;
    pAVar7 = (AllocMap *)pTVar5->list_[uVar3].list_;
    if (pAVar7 == (AllocMap *)0x0) {
LAB_00118b76:
      pAVar7 = (AllocMap *)
               tcmalloc::ThreadCache::FetchFromCentralCache
                         (pTVar5,uVar11,iVar1,anon_unknown.dwarf_505b::nop_oom_handler);
    }
    else {
      pFVar6 = pTVar5->list_ + uVar3;
      pFVar6->list_ = pAVar7->hashtable_;
      uVar8 = pFVar6->length_ - 1;
      pFVar6->length_ = uVar8;
      if (uVar8 < pFVar6->lowater_) {
        pFVar6->lowater_ = uVar8;
      }
      if (pAVar7 == (AllocMap *)0x0) goto LAB_00118b76;
      pTVar5->size_ = pTVar5->size_ - iVar1;
    }
    pAVar7->free_ = (Entry *)0x0;
    pAVar7->alloc_ = anon_unknown.dwarf_505b::do_malloc;
    pAVar7->dealloc_ = anon_unknown.dwarf_505b::do_free;
    pAVar7->allocated_ = (Object *)0x0;
    pTVar5 = (ThreadCache *)*in_FS_OFFSET;
    if (pTVar5 == (ThreadCache *)0x0) {
      TVar13 = tcmalloc::ThreadCachePtr::GetSlow();
      pTVar5 = TVar13.ptr_;
    }
    uVar3 = (ulong)DAT_0013d381;
    iVar1 = pTVar5->list_[uVar3].size_;
    __s = (Object *)pTVar5->list_[uVar3].list_;
    if (__s == (Object *)0x0) {
      __s = (Object *)
            tcmalloc::ThreadCache::FetchFromCentralCache
                      (pTVar5,(uint)DAT_0013d381,iVar1,anon_unknown.dwarf_505b::nop_oom_handler);
    }
    else {
      pFVar6 = pTVar5->list_ + uVar3;
      pFVar6->list_ = __s->next;
      uVar11 = pFVar6->length_ - 1;
      pFVar6->length_ = uVar11;
      if (uVar11 < pFVar6->lowater_) {
        pFVar6->lowater_ = uVar11;
      }
      pTVar5->size_ = pTVar5->size_ - iVar1;
    }
    memset(__s,0,0x8008);
    __s->next = pAVar7->allocated_;
    pAVar7->allocated_ = __s;
    pAVar7->hashtable_ = (Cluster **)(__s + 1);
    alloc_map_ = pAVar7;
  }
  AddressMap<int>::Insert(alloc_map_,this->size_and_magic2_,type);
  this->size1_ = size;
  this->offset_ = 0;
  this->alloc_type_ = (long)type;
  if (this->magic1_ != 0xabcdefab) {
    *(size_t *)((long)this->size_and_magic2_ + size + 8) = this->magic1_;
    *(size_t *)((long)this->size_and_magic2_ + this->size1_) = size;
  }
  SVar4.lockword_.super___atomic_base<int>._M_i =
       alloc_map_lock_.lockword_.super___atomic_base<int>._M_i;
  LOCK();
  alloc_map_lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x0;
  UNLOCK();
  if ((__atomic_base<int>)SVar4.lockword_.super___atomic_base<int>._M_i != (__atomic_base<int>)0x1)
  {
    SpinLock::SlowUnlock(&alloc_map_lock_);
  }
  memset(this->size_and_magic2_,0xab,size);
  if (this->magic1_ == 0xabcdefab) {
    return;
  }
  sVar2 = this->size1_;
  if (sVar2 == *(size_t *)((long)this->size_and_magic2_ + sVar2)) {
    if (this->magic1_ == *(size_t *)((long)this->size_and_magic2_ + sVar2 + 8)) {
      return;
    }
    pcVar10 = "Check failed: memcmp(&magic1_, magic2_addr(), sizeof(magic1_)) == 0: should hold\n";
    uVar9 = 0x51;
  }
  else {
    pcVar10 = "Check failed: memcmp(&size1_, size2_addr(), sizeof(size1_)) == 0: should hold\n";
    uVar9 = 0x4e;
  }
LAB_00118d12:
  syscall(1,2,pcVar10,uVar9);
  abort();
}

Assistant:

void Initialize(size_t size, int type) {
    RAW_CHECK(IsValidMagicValue(magic1_), "");
    // record us as allocated in the map
    alloc_map_lock_.Lock();
    if (!alloc_map_) {
      void* p = do_malloc(sizeof(AllocMap));
      alloc_map_ = new(p) AllocMap(do_malloc, do_free);
    }
    alloc_map_->Insert(data_addr(), type);
    // initialize us
    size1_ = size;
    offset_ = 0;
    alloc_type_ = type;
    if (!IsMMapped()) {
      bit_store(magic2_addr(), &magic1_);
      bit_store(size2_addr(), &size);
    }
    alloc_map_lock_.Unlock();
    memset(data_addr(), kMagicUninitializedByte, size);
    if (!IsMMapped()) {
      RAW_CHECK(memcmp(&size1_, size2_addr(), sizeof(size1_)) == 0, "should hold");
      RAW_CHECK(memcmp(&magic1_, magic2_addr(), sizeof(magic1_)) == 0, "should hold");
    }
  }